

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutCut.c
# Opt level: O2

Cut_Cut_t * Cut_CutAlloc(Cut_Man_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Cut_Cut_t *pCVar3;
  uint uVar4;
  int iVar5;
  
  pCVar3 = (Cut_Cut_t *)Extra_MmFixedEntryFetch(p->pMmCuts);
  *(undefined8 *)pCVar3 = 0;
  pCVar3->uCanon0 = 0;
  pCVar3->uCanon1 = 0;
  pCVar3->pNext = (Cut_Cut_t *)0x0;
  uVar4 = (p->pParams->nVarsMax & 0xfU) << 0x18;
  *(uint *)pCVar3 = uVar4;
  *(uint *)pCVar3 = (p->fSimul & 1U) << 0x16 | uVar4;
  uVar1 = p->nCutsCur;
  uVar2 = p->nCutsAlloc;
  p->nCutsCur = uVar1 + 1;
  p->nCutsAlloc = uVar2 + 1;
  iVar5 = (uVar2 + 1) - p->nCutsDealloc;
  if (p->nCutsPeak < iVar5) {
    p->nCutsPeak = iVar5;
  }
  return pCVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cut_Cut_t * Cut_CutAlloc( Cut_Man_t * p )
{
    Cut_Cut_t * pCut;
    // cut allocation
    pCut = (Cut_Cut_t *)Extra_MmFixedEntryFetch( p->pMmCuts );
    memset( pCut, 0, sizeof(Cut_Cut_t) );
    pCut->nVarsMax   = p->pParams->nVarsMax;
    pCut->fSimul     = p->fSimul;
    // statistics
    p->nCutsAlloc++;
    p->nCutsCur++;
    if ( p->nCutsPeak < p->nCutsAlloc - p->nCutsDealloc )
        p->nCutsPeak = p->nCutsAlloc - p->nCutsDealloc;
    return pCut;
}